

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O0

int translateKeyCodeB(int keySym)

{
  int keySym_local;
  int local_4;
  
  switch(keySym) {
  case 0xff8d:
    local_4 = 0x14f;
    break;
  default:
    local_4 = -1;
    break;
  case 0xffac:
  case 0xffae:
    local_4 = 0x14a;
    break;
  case 0xffb0:
    local_4 = 0x140;
    break;
  case 0xffb1:
    local_4 = 0x141;
    break;
  case 0xffb2:
    local_4 = 0x142;
    break;
  case 0xffb3:
    local_4 = 0x143;
    break;
  case 0xffb4:
    local_4 = 0x144;
    break;
  case 0xffb5:
    local_4 = 0x145;
    break;
  case 0xffb6:
    local_4 = 0x146;
    break;
  case 0xffb7:
    local_4 = 0x147;
    break;
  case 0xffb8:
    local_4 = 0x148;
    break;
  case 0xffb9:
    local_4 = 0x149;
    break;
  case 0xffbd:
    local_4 = 0x150;
  }
  return local_4;
}

Assistant:

static int 
translateKeyCodeB(int keySym) {

    switch (keySym)
    {
        case XK_KP_0:           return KB_KEY_KP_0;
        case XK_KP_1:           return KB_KEY_KP_1;
        case XK_KP_2:           return KB_KEY_KP_2;
        case XK_KP_3:           return KB_KEY_KP_3;
        case XK_KP_4:           return KB_KEY_KP_4;
        case XK_KP_5:           return KB_KEY_KP_5;
        case XK_KP_6:           return KB_KEY_KP_6;
        case XK_KP_7:           return KB_KEY_KP_7;
        case XK_KP_8:           return KB_KEY_KP_8;
        case XK_KP_9:           return KB_KEY_KP_9;
        case XK_KP_Separator:
        case XK_KP_Decimal:     return KB_KEY_KP_DECIMAL;
        case XK_KP_Equal:       return KB_KEY_KP_EQUAL;
        case XK_KP_Enter:       return KB_KEY_KP_ENTER;
    }

    return KB_KEY_UNKNOWN;
}